

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  ptls_esni_secret_t **esni;
  uint8_t *puVar1;
  byte bVar2;
  uint16_t uVar3;
  ushort uVar4;
  ptls_context_t *ppVar5;
  st_ptls_update_esni_key_t *psVar6;
  size_t *psVar7;
  st_ptls_key_exchange_algorithm_t *psVar8;
  uint8_t *puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar13;
  int iVar14;
  ptls_early_data_acceptance_t pVar15;
  uint uVar16;
  int iVar17;
  ptls_esni_secret_t *ppVar18;
  ptls_cipher_suite_t **pppVar19;
  ptls_hash_context_t *ppVar20;
  char *server_name;
  ptls_key_schedule_t *sched;
  uint64_t uVar21;
  long lVar22;
  size_t sVar23;
  ptls_key_exchange_algorithm_t *ppVar24;
  ptls_hash_context_t **pppVar25;
  size_t sVar26;
  ptls_key_exchange_algorithm_t **pppVar27;
  uint16_t in_R8W;
  uint uVar28;
  ulong uVar29;
  ptls_hash_algorithm_t *ppVar30;
  size_t sVar31;
  ptls_iovec_t *in_R9;
  ptls_iovec_t *ppVar32;
  undefined8 unaff_R12;
  ulong uVar33;
  ptls_iovec_t *ppVar34;
  ptls_cipher_suite_t *ppVar35;
  ulong uVar36;
  uint16_t *puVar37;
  ptls_buffer_t *ppVar38;
  ptls_iovec_t *ppVar39;
  size_t sVar40;
  ptls_iovec_t *ppVar41;
  ptls_key_schedule_t *ppVar42;
  bool bVar43;
  bool bVar44;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  uint32_t _v_1;
  uint16_t _v;
  uint64_t not_after;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint32_t lifetime;
  uint8_t binder_key [64];
  ptls_iovec_t *in_stack_fffffffffffffeb8;
  ptls_iovec_t *local_108;
  size_t sStack_100;
  ulong local_f8;
  ptls_key_exchange_algorithm_t **local_f0;
  ptls_handshake_properties_t *local_e8;
  ptls_iovec_t *local_e0;
  ptls_key_schedule_t *local_d8;
  ptls_buffer_t *local_d0;
  size_t local_c8;
  ptls_iovec_t *local_c0;
  ptls_iovec_t *local_b8;
  char *local_b0;
  ulong local_a8;
  uint local_a0;
  uint32_t local_9c;
  ptls_iovec_t local_98;
  size_t local_88;
  uint32_t local_7c;
  ptls_iovec_t local_78 [4];
  
  ppVar42 = tls->key_schedule;
  local_b8 = cookie;
  if (tls->server_name == (char *)0x0) {
    local_f0 = (ptls_key_exchange_algorithm_t **)0x0;
  }
  else {
    iVar14 = ptls_server_name_is_ipaddr(tls->server_name);
    local_f0 = (ptls_key_exchange_algorithm_t **)CONCAT71((int7)((ulong)unaff_R12 >> 8),iVar14 == 0)
    ;
  }
  local_e8 = properties;
  if (properties == (ptls_handshake_properties_t *)0x0) {
    local_f8 = 0;
    server_name = (char *)0x0;
    uVar29 = 0;
    local_e0 = (ptls_iovec_t *)0x0;
  }
  else {
    if (((ppVar42 == (ptls_key_schedule_t *)0x0 & (byte)local_f0) == 1) &&
       (ppVar39 = (ptls_iovec_t *)(properties->field_0).client.esni_keys.base,
       ppVar39 != (ptls_iovec_t *)0x0)) {
      ppVar5 = tls->ctx;
      ppVar38 = (ptls_buffer_t *)(properties->field_0).client.esni_keys.len;
      local_e0 = ppVar39;
      ppVar18 = (ptls_esni_secret_t *)malloc(0xd0);
      tls->esni = ppVar18;
      if (ppVar18 == (ptls_esni_secret_t *)0x0) {
        local_f8 = 0;
        iVar14 = 0x201;
        server_name = (char *)0x0;
      }
      else {
        memset(ppVar18,0,0xd0);
        ppVar39 = local_e0;
        local_108 = local_e0;
        local_d8 = ppVar42;
        if ((long)ppVar38 < 2) {
          uVar29 = 0x32;
          local_f8 = 0;
LAB_00109e16:
          server_name = (char *)0x0;
        }
        else {
          ppVar34 = (ptls_iovec_t *)((long)&local_e0->base + 2);
          local_108 = ppVar34;
          if ((ushort)(*(ushort *)&local_e0->base << 8 | *(ushort *)&local_e0->base >> 8) != 0xff02)
          {
            local_f8 = 0;
            uVar29 = 0x32;
            goto LAB_00109e16;
          }
          ppVar41 = (ptls_iovec_t *)((long)&ppVar38->base + (long)&local_e0->base);
          uVar29 = 0x32;
          if ((long)ppVar41 - (long)ppVar34 < 4) {
LAB_00109da7:
            local_f8 = 0;
            bVar44 = false;
          }
          else {
            pppVar19 = ppVar5->cipher_suites;
            ppVar35 = *pppVar19;
            if (ppVar35 == (ptls_cipher_suite_t *)0x0) {
              ppVar20 = (st_ptls_hash_context_t *)0x0;
            }
            else {
              ppVar20 = (st_ptls_hash_context_t *)0x0;
              do {
                pppVar19 = pppVar19 + 1;
                if ((ppVar35->id | 2) == 0x1303) {
                  ppVar20 = (*ppVar35->hash->create)();
                  break;
                }
                ppVar35 = *pppVar19;
              } while (ppVar35 != (ptls_cipher_suite_t *)0x0);
            }
            local_f8 = 0;
            if (ppVar20 == (st_ptls_hash_context_t *)0x0) {
              uVar29 = 0x203;
              goto LAB_00109da7;
            }
            local_d0 = ppVar38;
            (*ppVar20->update)(ppVar20,local_e0,(long)ppVar34 - (long)local_e0);
            (*ppVar20->update)(ppVar20,"",4);
            local_c0 = (ptls_iovec_t *)((long)&ppVar39->base + 6);
            (*ppVar20->update)(ppVar20,local_c0,(long)ppVar41 - (long)local_c0);
            bVar44 = false;
            (*ppVar20->final)(ppVar20,local_78,PTLS_HASH_FINAL_MODE_FREE);
            uVar29 = 0x32;
            ppVar38 = local_d0;
            if (*(int *)&ppVar34->base == (int)local_78[0].base) {
              local_108 = local_c0;
              bVar44 = true;
              uVar29 = 0;
            }
          }
          if (!bVar44) goto LAB_00109e16;
          ppVar18->version = 0xff02;
          uVar16 = 0x32;
          if ((ulong)((long)ppVar41 - (long)local_108) < 2) {
LAB_00109e07:
            server_name = (char *)0x0;
            bVar44 = false;
          }
          else {
            lVar22 = 0;
            uVar33 = 0;
            do {
              uVar33 = (ulong)*(uint8_t *)((long)&local_108->base + lVar22) | uVar33 << 8;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 2);
            ppVar39 = (ptls_iovec_t *)((long)&local_108->base + 2);
            local_108 = ppVar39;
            if ((ulong)((long)ppVar41 - (long)ppVar39) < uVar33) goto LAB_00109e07;
            uVar28 = (uint)uVar29;
            ppVar34 = (ptls_iovec_t *)((long)&ppVar39->base + uVar33);
            local_d0 = ppVar38;
            server_name = (char *)malloc(uVar33 + 1);
            if (server_name == (char *)0x0) {
              uVar28 = 0x201;
            }
            else {
              if (uVar33 != 0) {
                memcpy(server_name,ppVar39,uVar33);
              }
              server_name[uVar33] = '\0';
              local_108 = ppVar34;
            }
            uVar16 = 0x32;
            if (local_108 == ppVar34) {
              uVar16 = uVar28;
            }
            if (server_name == (char *)0x0) {
              uVar16 = uVar28;
            }
            bVar44 = server_name != (char *)0x0 && local_108 == ppVar34;
            ppVar38 = local_d0;
          }
          if (bVar44) {
            uVar29 = 0x32;
            if ((ulong)((long)ppVar41 - (long)local_108) < 2) {
              uVar36 = 0;
            }
            else {
              lVar22 = 0;
              uVar33 = 0;
              do {
                uVar33 = (ulong)*(uint8_t *)((long)&local_108->base + lVar22) | uVar33 << 8;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 2);
              local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
              uVar36 = 0;
              if (uVar33 <= (ulong)((long)ppVar41 - (long)local_108)) {
                ppVar39 = (ptls_iovec_t *)((long)&local_108->base + uVar33);
                in_R9 = (ptls_iovec_t *)0x0;
                uVar16 = select_key_share(&(ppVar18->client).key_share,local_78,
                                          ppVar5->key_exchanges,(uint8_t **)&local_108,
                                          (uint8_t *)ppVar39,0);
                uVar29 = 0x32;
                if (local_108 == ppVar39) {
                  uVar29 = uVar36;
                }
                if (uVar16 != 0) {
                  uVar29 = (ulong)uVar16;
                }
                uVar36 = (ulong)(uVar16 == 0 && local_108 == ppVar39);
              }
            }
            if ((char)uVar36 != '\0') {
              uVar29 = 0x32;
              if ((ulong)((long)ppVar41 - (long)local_108) < 2) {
LAB_0010a4bf:
                bVar44 = false;
                ppVar39 = local_108;
              }
              else {
                lVar22 = 0;
                uVar33 = 0;
                do {
                  uVar33 = (ulong)*(uint8_t *)((long)&local_108->base + lVar22) | uVar33 << 8;
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 2);
                local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
                if ((ulong)((long)ppVar41 - (long)local_108) < uVar33) goto LAB_0010a4bf;
                ppVar39 = (ptls_iovec_t *)((long)&local_108->base + uVar33);
                local_d0 = ppVar38;
                uVar16 = select_cipher(&(ppVar18->client).cipher,ppVar5->cipher_suites,
                                       (uint8_t *)local_108,(uint8_t *)ppVar39,
                                       *(uint *)&ppVar5->field_0x70 >> 6 & 1);
                uVar29 = 0;
                bVar44 = uVar16 == 0;
                ppVar38 = local_d0;
                if (!bVar44) {
                  uVar29 = (ulong)uVar16;
                  ppVar39 = local_108;
                }
              }
              local_108 = ppVar39;
              if ((bVar44) && (uVar29 = 0x32, 1 < (long)ppVar41 - (long)local_108)) {
                (ppVar18->client).padded_length =
                     *(ushort *)&local_108->base << 8 | *(ushort *)&local_108->base >> 8;
                local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
                uVar16 = ptls_decode64((uint64_t *)&local_98,(uint8_t **)&local_108,
                                       (uint8_t *)ppVar41);
                if ((uVar16 == 0) &&
                   (uVar16 = ptls_decode64(&local_a8,(uint8_t **)&local_108,(uint8_t *)ppVar41),
                   uVar16 == 0)) {
                  uVar29 = 0x32;
                  if ((ulong)((long)ppVar41 - (long)local_108) < 2) {
                    bVar44 = false;
                  }
                  else {
                    lVar22 = 0;
                    uVar33 = 0;
                    do {
                      uVar33 = (ulong)*(byte *)((long)&local_108->base + lVar22) | uVar33 << 8;
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 2);
                    local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
                    uVar16 = 0;
                    bVar44 = false;
                    if (uVar33 <= (ulong)((long)ppVar41 - (long)local_108)) {
                      if (uVar33 == 0) {
                        bVar44 = true;
                      }
                      else {
                        ppVar34 = (ptls_iovec_t *)((long)&local_108->base + uVar33);
                        ppVar39 = local_108;
                        do {
                          uVar29 = (ulong)((uint)(1 < (long)ppVar34 - (long)ppVar39) * 2);
                          local_108 = (ptls_iovec_t *)((long)&ppVar39->base + uVar29);
                          bVar44 = true;
                          uVar16 = 0x32;
                          in_R9 = local_108;
                          if ((long)ppVar34 - (long)ppVar39 < 2) {
                            bVar43 = false;
                          }
                          else {
                            uVar16 = 0x32;
                            if ((ulong)((long)ppVar34 - (long)local_108) < 2) {
                              bVar43 = false;
                            }
                            else {
                              lVar22 = 0;
                              ppVar32 = (ptls_iovec_t *)0x0;
                              do {
                                ppVar32 = (ptls_iovec_t *)
                                          ((ulong)*(byte *)((long)&local_108->base + lVar22) |
                                          (long)ppVar32 << 8);
                                lVar22 = lVar22 + 1;
                              } while (lVar22 != 2);
                              local_108 = (ptls_iovec_t *)((long)&ppVar39->base + uVar29 + 2);
                              in_R9 = (ptls_iovec_t *)((long)ppVar34 - (long)local_108);
                              bVar43 = false;
                              if (ppVar32 <= in_R9) {
                                local_108 = (ptls_iovec_t *)
                                            ((long)&ppVar32->base + (long)&local_108->base);
                                bVar43 = true;
                                bVar44 = false;
                                uVar16 = 0;
                              }
                            }
                          }
                          if (!bVar43) goto LAB_0010ac84;
                          ppVar39 = local_108;
                        } while (local_108 != ppVar34);
                        bVar44 = false;
LAB_0010ac84:
                        bVar44 = !bVar44;
                      }
                      uVar29 = (ulong)uVar16;
                    }
                  }
                  if (bVar44) {
                    if ((local_108 == ppVar41) &&
                       (uVar21 = (*ppVar5->get_time->cb)(ppVar5->get_time),
                       (ulong)((long)local_98.base * 1000) < uVar21 ||
                       (long)local_98.base * 1000 - uVar21 == 0)) {
                      uVar29 = 0x32;
                      if (uVar21 <= local_a8 * 1000) {
                        uVar29 = 0;
                      }
                    }
                    else {
                      uVar29 = 0x32;
                    }
                  }
                }
                else {
                  uVar29 = (ulong)uVar16;
                }
              }
            }
          }
          else {
            uVar29 = (ulong)uVar16;
          }
        }
        esni = &tls->esni;
        if ((int)uVar29 == 0) {
          (*ppVar5->random_bytes)((*esni)->nonce,0x10);
          in_R8W = (uint16_t)uVar29;
          ppVar18 = *esni;
          ppVar20 = (*((ppVar18->client).cipher)->hash->create)();
          if (ppVar20 == (ptls_hash_context_t *)0x0) {
            iVar14 = 0x201;
          }
          else {
            (*ppVar20->update)(ppVar20,local_e0,(size_t)ppVar38);
            (*ppVar20->final)(ppVar20,(ppVar18->client).record_digest,PTLS_HASH_FINAL_MODE_FREE);
            ppVar18 = *esni;
            psVar8 = (ppVar18->client).key_share;
            pVar13.base._4_4_ = local_78[0].base._4_4_;
            pVar13.base._0_4_ = (int)local_78[0].base;
            pVar13.len = local_78[0].len;
            iVar14 = (*psVar8->exchange)(psVar8,&(ppVar18->client).pubkey,&ppVar18->secret,pVar13);
            in_R8W = (uint16_t)local_78[0].len;
            if (iVar14 == 0) {
              in_stack_fffffffffffffeb8 = (ptls_iovec_t *)tls->client_random;
              ppVar18 = *esni;
              ppVar39 = &(ppVar18->client).pubkey;
              in_R8W = (uint16_t)ppVar39->base;
              in_R9 = (ptls_iovec_t *)(ppVar18->client).pubkey.len;
              iVar14 = build_esni_contents_hash
                                 (((ppVar18->client).cipher)->hash,ppVar18->esni_contents_hash,
                                  (ppVar18->client).record_digest,((ppVar18->client).key_share)->id,
                                  *ppVar39,(uint8_t *)in_stack_fffffffffffffeb8);
            }
          }
          ppVar42 = local_d8;
          if (iVar14 != 0) {
            free_esni_secret(esni,0);
            ppVar42 = local_d8;
          }
        }
        else {
          free(*esni);
          in_R8W = (uint16_t)uVar29;
          *esni = (ptls_esni_secret_t *)0x0;
          iVar14 = 0;
          ppVar42 = local_d8;
        }
      }
      if (iVar14 != 0) goto LAB_0010b522;
      psVar6 = tls->ctx->update_esni_key;
      if (psVar6 != (st_ptls_update_esni_key_t *)0x0) {
        ppVar18 = tls->esni;
        ppVar30 = ((ppVar18->client).cipher)->hash;
        in_R9 = (ptls_iovec_t *)ppVar18->esni_contents_hash;
        iVar14 = (*psVar6->cb)(psVar6,tls,ppVar18->secret,ppVar30,in_R9);
        in_R8W = (uint16_t)ppVar30;
        if (iVar14 != 0) goto LAB_0010b522;
      }
    }
    else {
      local_f8 = 0;
      server_name = (char *)0x0;
    }
    ppVar39 = (ptls_iovec_t *)(local_e8->field_0).client.session_ticket.base;
    if (ppVar39 == (ptls_iovec_t *)0x0) {
      local_e0 = (ptls_iovec_t *)0x0;
      uVar29 = 0;
    }
    else {
      ppVar34 = (ptls_iovec_t *)
                ((long)&ppVar39->base + (local_e8->field_0).client.session_ticket.len);
      local_108 = ppVar39;
      iVar14 = ptls_decode64(&local_a8,(uint8_t **)&local_108,(uint8_t *)ppVar34);
      local_d8 = ppVar42;
      if (iVar14 == 0) {
        lVar22 = (long)ppVar34 - (long)local_108;
        if (lVar22 < 2) {
          iVar14 = 0x32;
        }
        else {
          in_R9 = (ptls_iovec_t *)
                  (ulong)(ushort)(*(ushort *)&local_108->base << 8 |
                                 *(ushort *)&local_108->base >> 8);
          local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
          iVar14 = 0;
        }
        ppVar35 = (ptls_cipher_suite_t *)0x0;
        ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
        local_f8 = 0;
        uVar33 = 0;
        ppVar39 = (ptls_iovec_t *)0x0;
        if (1 < lVar22) {
          lVar22 = (long)ppVar34 - (long)local_108;
          if (lVar22 < 2) {
            iVar14 = 0x32;
          }
          else {
            in_R8W = *(ushort *)&local_108->base << 8 | *(ushort *)&local_108->base >> 8;
            local_108 = (ptls_iovec_t *)((long)&local_108->base + 2);
            iVar14 = 0;
          }
          ppVar35 = (ptls_cipher_suite_t *)0x0;
          ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
          local_f8 = 0;
          uVar33 = 0;
          ppVar39 = (ptls_iovec_t *)0x0;
          if (1 < lVar22) {
            ppVar35 = (ptls_cipher_suite_t *)0x0;
            if ((ulong)((long)ppVar34 - (long)local_108) < 3) {
LAB_00109c54:
              bVar44 = false;
              iVar14 = 0x32;
              ppVar41 = local_108;
            }
            else {
              lVar22 = 0;
              uVar29 = 0;
              do {
                uVar29 = (ulong)*(uint8_t *)((long)&local_108->base + lVar22) | uVar29 << 8;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              ppVar39 = (ptls_iovec_t *)((long)&local_108->base + 3);
              local_108 = ppVar39;
              if ((ulong)((long)ppVar34 - (long)ppVar39) < uVar29) goto LAB_00109c54;
              in_R9 = (ptls_iovec_t *)((ulong)in_R9 & 0xffffffff);
              ppVar41 = (ptls_iovec_t *)((long)&ppVar39->base + uVar29);
              iVar17 = decode_new_session_ticket
                                 (tls,&local_7c,&local_9c,local_78,&local_98,&local_a0,
                                  (uint8_t *)ppVar39,(uint8_t *)ppVar41);
              iVar14 = 0;
              bVar44 = iVar17 == 0;
              in_stack_fffffffffffffeb8 = ppVar39;
              if (!bVar44) {
                iVar14 = iVar17;
                ppVar41 = local_108;
              }
            }
            local_108 = ppVar41;
            if (bVar44) {
              local_f8 = 0;
              if ((ulong)((long)ppVar34 - (long)local_108) < 2) {
LAB_0010a00b:
                uVar33 = 0;
                ppVar39 = (ptls_iovec_t *)0x0;
                bVar44 = false;
                iVar14 = 0x32;
              }
              else {
                lVar22 = 0;
                uVar33 = 0;
                do {
                  uVar33 = (ulong)*(uint8_t *)((long)&local_108->base + lVar22) | uVar33 << 8;
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 2);
                ppVar39 = (ptls_iovec_t *)((long)&local_108->base + 2);
                local_108 = ppVar39;
                if ((ulong)((long)ppVar34 - (long)ppVar39) < uVar33) goto LAB_0010a00b;
                local_108 = (ptls_iovec_t *)((long)&ppVar39->base + uVar33);
                bVar44 = true;
              }
              if (bVar44) {
                if (local_108 == ppVar34) {
                  ppVar5 = tls->ctx;
                  pppVar27 = ppVar5->key_exchanges;
                  ppVar24 = *pppVar27;
                  local_f8 = 0;
                  bVar44 = ppVar24 == (ptls_key_exchange_algorithm_t *)0x0;
                  if (bVar44) {
LAB_0010a343:
                    ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
                    bVar44 = false;
                    iVar14 = 0x203;
                  }
                  else {
                    uVar3 = ppVar24->id;
                    while (uVar3 != (uint16_t)in_R9) {
                      pppVar27 = pppVar27 + 1;
                      ppVar24 = *pppVar27;
                      bVar44 = ppVar24 == (ptls_key_exchange_algorithm_t *)0x0;
                      if (bVar44) goto LAB_0010a343;
                      uVar3 = ppVar24->id;
                    }
                    if (bVar44) goto LAB_0010a343;
                    bVar44 = true;
                  }
                  if (!bVar44) {
                    ppVar35 = (ptls_cipher_suite_t *)0x0;
                    goto LAB_0010a060;
                  }
                  pppVar19 = ppVar5->cipher_suites;
                  ppVar35 = *pppVar19;
                  local_f8 = 0;
                  bVar44 = ppVar35 == (ptls_cipher_suite_t *)0x0;
                  if (bVar44) {
LAB_0010a62d:
                    ppVar35 = (ptls_cipher_suite_t *)0x0;
                    bVar44 = false;
                    iVar14 = 0x203;
                  }
                  else {
                    uVar3 = ppVar35->id;
                    while (uVar3 != in_R8W) {
                      pppVar19 = pppVar19 + 1;
                      ppVar35 = *pppVar19;
                      bVar44 = ppVar35 == (ptls_cipher_suite_t *)0x0;
                      if (bVar44) goto LAB_0010a62d;
                      uVar3 = ppVar35->id;
                    }
                    if (bVar44) goto LAB_0010a62d;
                    bVar44 = true;
                  }
                  if (bVar44) {
                    uVar21 = (*ppVar5->get_time->cb)(ppVar5->get_time);
                    if ((uVar21 < local_a8) || (0x240c83ff < uVar21 - local_a8)) goto LAB_0010a054;
                    local_f8 = (ulong)((int)(uVar21 - local_a8) + local_9c);
                    iVar14 = 0;
                  }
                }
                else {
                  ppVar35 = (ptls_cipher_suite_t *)0x0;
                  ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
                  local_f8 = 0;
LAB_0010a054:
                  iVar14 = 0x32;
                }
              }
              else {
                ppVar35 = (ptls_cipher_suite_t *)0x0;
                ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
              }
            }
            else {
              ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
              local_f8 = 0;
              uVar33 = 0;
              ppVar39 = (ptls_iovec_t *)0x0;
            }
          }
        }
      }
      else {
        ppVar35 = (ptls_cipher_suite_t *)0x0;
        ppVar24 = (ptls_key_exchange_algorithm_t *)0x0;
        local_f8 = 0;
        uVar33 = 0;
        ppVar39 = (ptls_iovec_t *)0x0;
      }
LAB_0010a060:
      local_e0 = (ptls_iovec_t *)0x0;
      uVar29 = 0;
      ppVar42 = local_d8;
      if (iVar14 == 0) {
        bVar2 = (tls->field_18).server.pending_traffic_secret[0x38];
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 1;
        if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
          tls->key_share = ppVar24;
        }
        tls->cipher_suite = ppVar35;
        uVar29 = uVar33;
        local_e0 = ppVar39;
        if ((local_a0 != 0 && local_d8 == (ptls_key_schedule_t *)0x0) &&
           ((local_e8->field_0).client.max_early_data_size != (size_t *)0x0)) {
          (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 3;
          *(local_e8->field_0).client.max_early_data_size = (ulong)local_a0;
        }
      }
    }
    pVar15 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
      psVar7 = (local_e8->field_0).client.max_early_data_size;
      pVar15 = PTLS_EARLY_DATA_REJECTED;
      if (psVar7 != (size_t *)0x0) {
        *psVar7 = 0;
      }
    }
    (local_e8->field_0).client.early_data_acceptance = pVar15;
  }
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     ((local_e8 == (ptls_handshake_properties_t *)0x0 ||
      (((local_e8->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *tls->ctx->key_exchanges;
  }
  if (ppVar42 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = sched;
    ikm.len = uVar29;
    ikm.base = (uint8_t *)local_e0;
    iVar14 = key_schedule_extract(sched,ikm);
    if (iVar14 != 0) goto LAB_0010b522;
  }
  ppVar39 = (ptls_iovec_t *)(emitter->record_header_length + emitter->buf->off);
  iVar14 = (*emitter->begin_message)(emitter);
  if (iVar14 == 0) {
    ppVar38 = emitter->buf;
    iVar14 = ptls_buffer_reserve(ppVar38,1);
    if (iVar14 == 0) {
      ppVar38->base[ppVar38->off] = '\x01';
      ppVar38->off = ppVar38->off + 1;
      iVar14 = 0;
    }
    bVar44 = true;
    local_d0 = ppVar38;
    if (iVar14 == 0) {
      iVar14 = ptls_buffer_reserve(ppVar38,3);
      if (iVar14 == 0) {
        puVar9 = local_d0->base;
        sVar40 = local_d0->off;
        puVar9[sVar40 + 2] = '\0';
        puVar9 = puVar9 + sVar40;
        puVar9[0] = '\0';
        puVar9[1] = '\0';
        local_d0->off = local_d0->off + 3;
        iVar14 = 0;
      }
      if (iVar14 == 0) {
        sVar40 = local_d0->off;
        ppVar38 = emitter->buf;
        local_d8 = ppVar42;
        iVar14 = ptls_buffer_reserve(ppVar38,2);
        if (iVar14 == 0) {
          puVar9 = ppVar38->base;
          sVar26 = ppVar38->off;
          (puVar9 + sVar26)[0] = '\x03';
          (puVar9 + sVar26)[1] = '\x03';
          ppVar38->off = ppVar38->off + 2;
          iVar14 = 0;
        }
        bVar44 = iVar14 != 0;
        local_c0 = ppVar39;
        if (iVar14 == 0) {
          iVar14 = ptls_buffer_reserve(ppVar38,0x20);
          if (iVar14 == 0) {
            puVar9 = ppVar38->base;
            sVar26 = ppVar38->off;
            uVar10 = *(undefined8 *)tls->client_random;
            uVar11 = *(undefined8 *)(tls->client_random + 8);
            uVar12 = *(undefined8 *)(tls->client_random + 0x18);
            puVar1 = puVar9 + sVar26 + 0x10;
            *(undefined8 *)puVar1 = *(undefined8 *)(tls->client_random + 0x10);
            *(undefined8 *)(puVar1 + 8) = uVar12;
            puVar9 = puVar9 + sVar26;
            *(undefined8 *)puVar9 = uVar10;
            *(undefined8 *)(puVar9 + 8) = uVar11;
            ppVar38->off = ppVar38->off + 0x20;
            iVar14 = 0;
          }
          bVar44 = true;
          if (iVar14 == 0) {
            iVar14 = ptls_buffer_reserve(ppVar38,1);
            if (iVar14 == 0) {
              ppVar38->base[ppVar38->off] = '\0';
              ppVar38->off = ppVar38->off + 1;
              iVar14 = 0;
            }
            bVar44 = true;
            if (iVar14 == 0) {
              sVar26 = ppVar38->off;
              iVar17 = ptls_buffer__do_pushv
                                 (ppVar38,(tls->field_18).client.legacy_session_id.base,
                                  (tls->field_18).client.legacy_session_id.len);
              iVar14 = 0;
              if (iVar17 == 0) {
                ppVar38->base[sVar26 - 1] = (char)(int)ppVar38->off - (char)sVar26;
                bVar43 = true;
                bVar44 = false;
              }
              else {
                bVar43 = false;
                iVar14 = iVar17;
              }
            }
            else {
              bVar43 = false;
            }
            if (bVar43) {
              iVar14 = ptls_buffer_reserve(ppVar38,2);
              if (iVar14 == 0) {
                puVar9 = ppVar38->base;
                sVar26 = ppVar38->off;
                (puVar9 + sVar26)[0] = '\0';
                (puVar9 + sVar26)[1] = '\0';
                ppVar38->off = ppVar38->off + 2;
                iVar14 = 0;
              }
              bVar44 = true;
              if (iVar14 == 0) {
                sVar26 = ppVar38->off;
                pppVar19 = tls->ctx->cipher_suites;
                ppVar35 = *pppVar19;
                bVar44 = false;
                if (ppVar35 == (ptls_cipher_suite_t *)0x0) {
                  bVar43 = true;
                  iVar14 = 0;
                }
                else {
                  do {
                    pppVar19 = pppVar19 + 1;
                    uVar4 = ppVar35->id;
                    iVar14 = ptls_buffer_reserve(ppVar38,2);
                    if (iVar14 == 0) {
                      *(ushort *)(ppVar38->base + ppVar38->off) = uVar4 << 8 | uVar4 >> 8;
                      ppVar38->off = ppVar38->off + 2;
                      iVar14 = 0;
                    }
                    bVar43 = iVar14 == 0;
                    if (!bVar43) {
                      bVar44 = true;
                      break;
                    }
                    ppVar35 = *pppVar19;
                  } while (ppVar35 != (ptls_cipher_suite_t *)0x0);
                }
                if (bVar43) {
                  uVar29 = ppVar38->off - sVar26;
                  lVar22 = 8;
                  do {
                    ppVar38->base[sVar26 - 2] = (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                    lVar22 = lVar22 + -8;
                    sVar26 = sVar26 + 1;
                  } while (lVar22 != -8);
                  bVar44 = false;
                }
              }
              if (!bVar44) {
                iVar14 = ptls_buffer_reserve(ppVar38,1);
                if (iVar14 == 0) {
                  ppVar38->base[ppVar38->off] = '\0';
                  ppVar38->off = ppVar38->off + 1;
                  iVar14 = 0;
                }
                bVar44 = true;
                if (iVar14 == 0) {
                  sVar26 = ppVar38->off;
                  iVar14 = ptls_buffer_reserve(ppVar38,1);
                  if (iVar14 == 0) {
                    ppVar38->base[ppVar38->off] = '\0';
                    ppVar38->off = ppVar38->off + 1;
                    iVar14 = 0;
                  }
                  bVar43 = false;
                  if (iVar14 == 0) {
                    ppVar38->base[sVar26 - 1] = (char)(int)ppVar38->off - (char)sVar26;
                    bVar43 = true;
                    bVar44 = false;
                    iVar14 = 0;
                  }
                }
                else {
                  bVar43 = false;
                }
                if (bVar43) {
                  iVar14 = ptls_buffer_reserve(ppVar38,2);
                  if (iVar14 == 0) {
                    puVar9 = ppVar38->base;
                    sVar26 = ppVar38->off;
                    (puVar9 + sVar26)[0] = '\0';
                    (puVar9 + sVar26)[1] = '\0';
                    ppVar38->off = ppVar38->off + 2;
                    iVar14 = 0;
                  }
                  bVar44 = true;
                  if (iVar14 == 0) {
                    local_88 = ppVar38->off;
                    iVar14 = ptls_buffer_reserve(ppVar38,2);
                    if (iVar14 == 0) {
                      puVar9 = ppVar38->base;
                      sVar26 = ppVar38->off;
                      (puVar9 + sVar26)[0] = '\0';
                      (puVar9 + sVar26)[1] = '3';
                      ppVar38->off = ppVar38->off + 2;
                      iVar14 = 0;
                    }
                    bVar44 = iVar14 != 0;
                    if (iVar14 == 0) {
                      iVar14 = ptls_buffer_reserve(ppVar38,2);
                      if (iVar14 == 0) {
                        puVar9 = ppVar38->base;
                        sVar26 = ppVar38->off;
                        (puVar9 + sVar26)[0] = '\0';
                        (puVar9 + sVar26)[1] = '\0';
                        ppVar38->off = ppVar38->off + 2;
                        iVar14 = 0;
                      }
                      if (iVar14 == 0) {
                        local_c8 = ppVar38->off;
                        iVar14 = ptls_buffer_reserve(ppVar38,2);
                        if (iVar14 == 0) {
                          puVar9 = ppVar38->base;
                          sVar26 = ppVar38->off;
                          (puVar9 + sVar26)[0] = '\0';
                          (puVar9 + sVar26)[1] = '\0';
                          ppVar38->off = ppVar38->off + 2;
                          iVar14 = 0;
                        }
                        bVar44 = true;
                        if (iVar14 == 0) {
                          sVar26 = ppVar38->off;
                          psVar8 = tls->key_share;
                          if ((psVar8 != (st_ptls_key_exchange_algorithm_t *)0x0) &&
                             ((iVar14 = (*psVar8->create)(psVar8,&(tls->field_18).client.
                                                                  key_share_ctx), iVar14 != 0 ||
                              (iVar14 = push_key_share_entry
                                                  (ppVar38,tls->key_share->id,
                                                   ((tls->field_18).client.key_share_ctx)->pubkey),
                              iVar14 != 0)))) goto LAB_0010aa7e;
                          uVar29 = ppVar38->off - sVar26;
                          lVar22 = 8;
                          do {
                            ppVar38->base[sVar26 - 2] = (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                            lVar22 = lVar22 + -8;
                            sVar26 = sVar26 + 1;
                          } while (lVar22 != -8);
                          bVar44 = false;
                          bVar43 = true;
                          iVar14 = 0;
                        }
                        else {
LAB_0010aa7e:
                          bVar43 = false;
                        }
                        if (bVar43) {
                          local_b0 = (char *)(ppVar38->off - local_c8);
                          lVar22 = 8;
                          sVar26 = local_c8;
                          do {
                            ppVar38->base[sVar26 - 2] =
                                 (uint8_t)((ulong)local_b0 >> ((byte)lVar22 & 0x3f));
                            lVar22 = lVar22 + -8;
                            sVar26 = sVar26 + 1;
                          } while (lVar22 != -8);
                          bVar44 = false;
                        }
                      }
                      else {
                        bVar44 = true;
                      }
                      if (!bVar44) {
                        if ((char)local_f0 != '\0') {
                          if (tls->esni == (ptls_esni_secret_t *)0x0) {
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\0';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = iVar14 != 0;
                            if (bVar44) goto LAB_0010b2b9;
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\0';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            if (iVar14 == 0) {
                              sVar26 = ppVar38->off;
                              iVar14 = emit_server_name_extension(ppVar38,tls->server_name);
                              if (iVar14 == 0) {
                                uVar29 = ppVar38->off - sVar26;
                                lVar22 = 8;
                                do {
                                  ppVar38->base[sVar26 - 2] =
                                       (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                  lVar22 = lVar22 + -8;
                                  sVar26 = sVar26 + 1;
                                } while (lVar22 != -8);
                                goto LAB_0010b00b;
                              }
                            }
                            goto LAB_0010ad8f;
                          }
                          if (server_name != (char *)0x0) {
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\0';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = iVar14 != 0;
                            if (bVar44) goto LAB_0010b2b9;
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\0';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = true;
                            if (iVar14 == 0) {
                              sVar26 = ppVar38->off;
                              iVar14 = emit_server_name_extension(ppVar38,server_name);
                              if (iVar14 != 0) goto LAB_0010ab88;
                              uVar29 = ppVar38->off - sVar26;
                              lVar22 = 8;
                              do {
                                ppVar38->base[sVar26 - 2] =
                                     (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                lVar22 = lVar22 + -8;
                                sVar26 = sVar26 + 1;
                              } while (lVar22 != -8);
                              bVar44 = false;
                              bVar43 = true;
                              iVar14 = 0;
                            }
                            else {
LAB_0010ab88:
                              bVar43 = false;
                            }
                            if (!bVar43) goto LAB_0010b2b9;
                          }
                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                          if (iVar14 == 0) {
                            puVar9 = ppVar38->base;
                            sVar26 = ppVar38->off;
                            (puVar9 + sVar26)[0] = 0xff;
                            (puVar9 + sVar26)[1] = 0xce;
                            ppVar38->off = ppVar38->off + 2;
                            iVar14 = 0;
                          }
                          bVar44 = iVar14 != 0;
                          if (bVar44) goto LAB_0010b2b9;
                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                          if (iVar14 == 0) {
                            puVar9 = ppVar38->base;
                            sVar26 = ppVar38->off;
                            (puVar9 + sVar26)[0] = '\0';
                            (puVar9 + sVar26)[1] = '\0';
                            ppVar38->off = ppVar38->off + 2;
                            iVar14 = 0;
                          }
                          if (iVar14 == 0) {
                            sVar26 = ppVar38->off;
                            esni_keys.len = local_c8;
                            esni_keys.base = (uint8_t *)tls->server_name;
                            iVar14 = emit_esni_extension(tls->esni,ppVar38,esni_keys,local_b0,
                                                         (size_t)in_R9,
                                                         (size_t)in_stack_fffffffffffffeb8);
                            if (iVar14 != 0) goto LAB_0010ad8f;
                            uVar29 = ppVar38->off - sVar26;
                            lVar22 = 8;
                            do {
                              ppVar38->base[sVar26 - 2] = (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f))
                              ;
                              lVar22 = lVar22 + -8;
                              sVar26 = sVar26 + 1;
                            } while (lVar22 != -8);
LAB_0010b00b:
                            bVar44 = false;
                            bVar43 = true;
                            iVar14 = 0;
                          }
                          else {
LAB_0010ad8f:
                            bVar44 = true;
                            bVar43 = false;
                          }
                          if (!bVar43) goto LAB_0010b2b9;
                        }
                        if ((local_e8 == (ptls_handshake_properties_t *)0x0) ||
                           ((local_e8->field_0).client.negotiated_protocols.count == 0)) {
LAB_0010b0a6:
                          if (tls->ctx->decompress_certificate ==
                              (ptls_decompress_certificate_t *)0x0) {
LAB_0010b272:
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '+';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = iVar14 != 0;
                            if (!bVar44) {
                              iVar14 = ptls_buffer_reserve(ppVar38,2);
                              if (iVar14 == 0) {
                                puVar9 = ppVar38->base;
                                sVar26 = ppVar38->off;
                                (puVar9 + sVar26)[0] = '\0';
                                (puVar9 + sVar26)[1] = '\0';
                                ppVar38->off = ppVar38->off + 2;
                                iVar14 = 0;
                              }
                              bVar44 = true;
                              if (iVar14 == 0) {
                                sVar26 = ppVar38->off;
                                iVar14 = ptls_buffer_reserve(ppVar38,1);
                                if (iVar14 == 0) {
                                  ppVar38->base[ppVar38->off] = '\0';
                                  ppVar38->off = ppVar38->off + 1;
                                  iVar14 = 0;
                                }
                                bVar44 = true;
                                if (iVar14 == 0) {
                                  local_f0 = (ptls_key_exchange_algorithm_t **)ppVar38->off;
                                  lVar22 = 0;
                                  do {
                                    uVar4 = *(ushort *)((long)supported_versions + lVar22);
                                    iVar14 = ptls_buffer_reserve(ppVar38,2);
                                    if (iVar14 == 0) {
                                      *(ushort *)(ppVar38->base + ppVar38->off) =
                                           uVar4 << 8 | uVar4 >> 8;
                                      ppVar38->off = ppVar38->off + 2;
                                      iVar14 = 0;
                                    }
                                    if (iVar14 != 0) {
                                      bVar44 = true;
                                      goto LAB_0010b684;
                                    }
                                    lVar22 = lVar22 + 2;
                                  } while (lVar22 != 8);
                                  bVar44 = false;
LAB_0010b684:
                                  if (iVar14 == 0) {
                                    (ppVar38->base + -1)[(long)local_f0] =
                                         (char)(int)ppVar38->off - (char)local_f0;
                                    bVar44 = false;
                                  }
                                }
                                if (!bVar44) {
                                  uVar29 = ppVar38->off - sVar26;
                                  lVar22 = 8;
                                  do {
                                    ppVar38->base[sVar26 - 2] =
                                         (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                    lVar22 = lVar22 + -8;
                                    sVar26 = sVar26 + 1;
                                  } while (lVar22 != -8);
                                  bVar44 = false;
                                }
                              }
                              if (!bVar44) {
                                iVar14 = ptls_buffer_reserve(ppVar38,2);
                                if (iVar14 == 0) {
                                  puVar9 = ppVar38->base;
                                  sVar26 = ppVar38->off;
                                  (puVar9 + sVar26)[0] = '\0';
                                  (puVar9 + sVar26)[1] = '\r';
                                  ppVar38->off = ppVar38->off + 2;
                                  iVar14 = 0;
                                }
                                bVar44 = iVar14 != 0;
                                if (!bVar44) {
                                  iVar14 = ptls_buffer_reserve(ppVar38,2);
                                  if (iVar14 == 0) {
                                    puVar9 = ppVar38->base;
                                    sVar26 = ppVar38->off;
                                    (puVar9 + sVar26)[0] = '\0';
                                    (puVar9 + sVar26)[1] = '\0';
                                    ppVar38->off = ppVar38->off + 2;
                                    iVar14 = 0;
                                  }
                                  bVar44 = true;
                                  if (iVar14 == 0) {
                                    sVar26 = ppVar38->off;
                                    iVar14 = push_signature_algorithms
                                                       (tls->ctx->verify_certificate,ppVar38);
                                    if (iVar14 != 0) goto LAB_0010b780;
                                    uVar29 = ppVar38->off - sVar26;
                                    lVar22 = 8;
                                    do {
                                      ppVar38->base[sVar26 - 2] =
                                           (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                      lVar22 = lVar22 + -8;
                                      sVar26 = sVar26 + 1;
                                    } while (lVar22 != -8);
                                    bVar44 = false;
                                    bVar43 = true;
                                    iVar14 = 0;
                                  }
                                  else {
LAB_0010b780:
                                    bVar43 = false;
                                  }
                                  if (bVar43) {
                                    iVar14 = ptls_buffer_reserve(ppVar38,2);
                                    if (iVar14 == 0) {
                                      puVar9 = ppVar38->base;
                                      sVar26 = ppVar38->off;
                                      (puVar9 + sVar26)[0] = '\0';
                                      (puVar9 + sVar26)[1] = '\n';
                                      ppVar38->off = ppVar38->off + 2;
                                      iVar14 = 0;
                                    }
                                    bVar44 = iVar14 != 0;
                                    if (!bVar44) {
                                      iVar14 = ptls_buffer_reserve(ppVar38,2);
                                      if (iVar14 == 0) {
                                        puVar9 = ppVar38->base;
                                        sVar26 = ppVar38->off;
                                        (puVar9 + sVar26)[0] = '\0';
                                        (puVar9 + sVar26)[1] = '\0';
                                        ppVar38->off = ppVar38->off + 2;
                                        iVar14 = 0;
                                      }
                                      bVar44 = true;
                                      if (iVar14 == 0) {
                                        sVar26 = ppVar38->off;
                                        local_f0 = tls->ctx->key_exchanges;
                                        iVar14 = ptls_buffer_reserve(ppVar38,2);
                                        if (iVar14 == 0) {
                                          puVar9 = ppVar38->base;
                                          sVar31 = ppVar38->off;
                                          (puVar9 + sVar31)[0] = '\0';
                                          (puVar9 + sVar31)[1] = '\0';
                                          ppVar38->off = ppVar38->off + 2;
                                          iVar14 = 0;
                                        }
                                        bVar44 = true;
                                        if (iVar14 == 0) {
                                          sVar31 = ppVar38->off;
                                          ppVar24 = *local_f0;
                                          iVar14 = 0;
                                          if (ppVar24 != (ptls_key_exchange_algorithm_t *)0x0) {
                                            local_f0 = local_f0 + 1;
                                            do {
                                              local_c8 = CONCAT62(local_c8._2_6_,ppVar24->id);
                                              iVar14 = ptls_buffer_reserve(ppVar38,2);
                                              if (iVar14 == 0) {
                                                *(ushort *)(ppVar38->base + ppVar38->off) =
                                                     (ushort)local_c8 << 8 | (ushort)local_c8 >> 8;
                                                ppVar38->off = ppVar38->off + 2;
                                                iVar14 = 0;
                                              }
                                              if (iVar14 != 0) {
                                                bVar43 = false;
                                                goto LAB_0010b96b;
                                              }
                                              ppVar24 = *local_f0;
                                              local_f0 = local_f0 + 1;
                                            } while (ppVar24 != (ptls_key_exchange_algorithm_t *)0x0
                                                    );
                                          }
                                          uVar29 = ppVar38->off - sVar31;
                                          lVar22 = 8;
                                          do {
                                            ppVar38->base[sVar31 - 2] =
                                                 (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                            lVar22 = lVar22 + -8;
                                            sVar31 = sVar31 + 1;
                                          } while (lVar22 != -8);
                                          bVar44 = false;
                                          bVar43 = true;
                                        }
                                        else {
                                          bVar43 = false;
                                        }
LAB_0010b96b:
                                        if (bVar43) {
                                          uVar29 = ppVar38->off - sVar26;
                                          lVar22 = 8;
                                          do {
                                            ppVar38->base[sVar26 - 2] =
                                                 (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                            lVar22 = lVar22 + -8;
                                            sVar26 = sVar26 + 1;
                                          } while (lVar22 != -8);
                                          bVar44 = false;
                                        }
                                      }
                                      if (!bVar44) {
                                        if ((local_b8 != (ptls_iovec_t *)0x0) &&
                                           (local_b8->base != (uint8_t *)0x0)) {
                                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                                          if (iVar14 == 0) {
                                            puVar9 = ppVar38->base;
                                            sVar26 = ppVar38->off;
                                            (puVar9 + sVar26)[0] = '\0';
                                            (puVar9 + sVar26)[1] = ',';
                                            ppVar38->off = ppVar38->off + 2;
                                            iVar14 = 0;
                                          }
                                          bVar44 = iVar14 != 0;
                                          if (bVar44) goto LAB_0010b2b9;
                                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                                          if (iVar14 == 0) {
                                            puVar9 = ppVar38->base;
                                            sVar26 = ppVar38->off;
                                            (puVar9 + sVar26)[0] = '\0';
                                            (puVar9 + sVar26)[1] = '\0';
                                            ppVar38->off = ppVar38->off + 2;
                                            iVar14 = 0;
                                          }
                                          bVar44 = true;
                                          if (iVar14 == 0) {
                                            sVar26 = ppVar38->off;
                                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                                            if (iVar14 == 0) {
                                              puVar9 = ppVar38->base;
                                              sVar31 = ppVar38->off;
                                              (puVar9 + sVar31)[0] = '\0';
                                              (puVar9 + sVar31)[1] = '\0';
                                              ppVar38->off = ppVar38->off + 2;
                                              iVar14 = 0;
                                            }
                                            bVar44 = true;
                                            if (iVar14 == 0) {
                                              sVar31 = ppVar38->off;
                                              iVar14 = ptls_buffer__do_pushv
                                                                 (ppVar38,local_b8->base,
                                                                  local_b8->len);
                                              if (iVar14 != 0) goto LAB_0010baad;
                                              uVar29 = ppVar38->off - sVar31;
                                              lVar22 = 8;
                                              do {
                                                ppVar38->base[sVar31 - 2] =
                                                     (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                                lVar22 = lVar22 + -8;
                                                sVar31 = sVar31 + 1;
                                              } while (lVar22 != -8);
                                              bVar44 = false;
                                              bVar43 = true;
                                              iVar14 = 0;
                                            }
                                            else {
LAB_0010baad:
                                              bVar43 = false;
                                            }
                                            if (bVar43) {
                                              uVar29 = ppVar38->off - sVar26;
                                              lVar22 = 8;
                                              do {
                                                ppVar38->base[sVar26 - 2] =
                                                     (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                                lVar22 = lVar22 + -8;
                                                sVar26 = sVar26 + 1;
                                              } while (lVar22 != -8);
                                              bVar44 = false;
                                            }
                                          }
                                          if (bVar44) goto LAB_0010b2b9;
                                        }
                                        if ((tls->ctx->field_0x70 & 0x20) == 0) {
LAB_0010bafd:
                                          iVar14 = push_additional_extensions(local_e8,ppVar38);
                                          bVar44 = true;
                                          if (iVar14 == 0) {
                                            iVar14 = 0;
                                            if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0
                                                && local_e0 == (ptls_iovec_t *)0x0) {
LAB_0010bcf4:
                                              if (local_e0 == (ptls_iovec_t *)0x0) {
LAB_0010c28d:
                                                bVar44 = false;
                                              }
                                              else if (((tls->field_18).server.
                                                        pending_traffic_secret[0x38] & 2) == 0 ||
                                                       local_d8 != (ptls_key_schedule_t *)0x0) {
LAB_0010bd20:
                                                iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                if (iVar14 == 0) {
                                                  puVar9 = ppVar38->base;
                                                  sVar26 = ppVar38->off;
                                                  (puVar9 + sVar26)[0] = '\0';
                                                  (puVar9 + sVar26)[1] = ')';
                                                  ppVar38->off = ppVar38->off + 2;
                                                  iVar14 = 0;
                                                }
                                                bVar44 = iVar14 != 0;
                                                if (!bVar44) {
                                                  iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                  if (iVar14 == 0) {
                                                    puVar9 = ppVar38->base;
                                                    sVar26 = ppVar38->off;
                                                    (puVar9 + sVar26)[0] = '\0';
                                                    (puVar9 + sVar26)[1] = '\0';
                                                    ppVar38->off = ppVar38->off + 2;
                                                    iVar14 = 0;
                                                  }
                                                  bVar44 = true;
                                                  if (iVar14 == 0) {
                                                    local_e8 = (ptls_handshake_properties_t *)
                                                               ppVar38->off;
                                                    iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                    if (iVar14 == 0) {
                                                      puVar9 = ppVar38->base;
                                                      sVar26 = ppVar38->off;
                                                      (puVar9 + sVar26)[0] = '\0';
                                                      (puVar9 + sVar26)[1] = '\0';
                                                      ppVar38->off = ppVar38->off + 2;
                                                      iVar14 = 0;
                                                    }
                                                    bVar44 = true;
                                                    if (iVar14 == 0) {
                                                      sVar26 = ppVar38->off;
                                                      iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                      if (iVar14 == 0) {
                                                        puVar9 = ppVar38->base;
                                                        sVar31 = ppVar38->off;
                                                        (puVar9 + sVar31)[0] = '\0';
                                                        (puVar9 + sVar31)[1] = '\0';
                                                        ppVar38->off = ppVar38->off + 2;
                                                        iVar14 = 0;
                                                      }
                                                      bVar44 = true;
                                                      if (iVar14 == 0) {
                                                        sVar31 = ppVar38->off;
                                                        iVar14 = ptls_buffer__do_pushv
                                                                           (ppVar38,local_98.base,
                                                                            local_98.len);
                                                        if (iVar14 != 0) goto LAB_0010be46;
                                                        uVar29 = ppVar38->off - sVar31;
                                                        lVar22 = 8;
                                                        do {
                                                          ppVar38->base[sVar31 - 2] =
                                                               (uint8_t)(uVar29 >>
                                                                        ((byte)lVar22 & 0x3f));
                                                          lVar22 = lVar22 + -8;
                                                          sVar31 = sVar31 + 1;
                                                        } while (lVar22 != -8);
                                                        bVar44 = false;
                                                        bVar43 = true;
                                                        iVar14 = 0;
                                                      }
                                                      else {
LAB_0010be46:
                                                        bVar43 = false;
                                                      }
                                                      if (bVar43) {
                                                        iVar14 = ptls_buffer_reserve(ppVar38,4);
                                                        if (iVar14 == 0) {
                                                          uVar16 = (uint)local_f8;
                                                          *(uint *)(ppVar38->base + ppVar38->off) =
                                                               uVar16 >> 0x18 |
                                                               (uVar16 & 0xff0000) >> 8 |
                                                               (uVar16 & 0xff00) << 8 |
                                                               uVar16 << 0x18;
                                                          ppVar38->off = ppVar38->off + 4;
                                                          iVar14 = 0;
                                                        }
                                                        bVar44 = iVar14 != 0;
                                                        if (iVar14 == 0) {
                                                          uVar29 = ppVar38->off - sVar26;
                                                          lVar22 = 8;
                                                          do {
                                                            ppVar38->base[sVar26 - 2] =
                                                                 (uint8_t)(uVar29 >>
                                                                          ((byte)lVar22 & 0x3f));
                                                            lVar22 = lVar22 + -8;
                                                            sVar26 = sVar26 + 1;
                                                          } while (lVar22 != -8);
                                                          bVar44 = false;
                                                        }
                                                      }
                                                    }
                                                    if (!bVar44) {
                                                      iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                      if (iVar14 == 0) {
                                                        puVar9 = ppVar38->base;
                                                        sVar26 = ppVar38->off;
                                                        (puVar9 + sVar26)[0] = '\0';
                                                        (puVar9 + sVar26)[1] = '\0';
                                                        ppVar38->off = ppVar38->off + 2;
                                                        iVar14 = 0;
                                                      }
                                                      bVar44 = true;
                                                      if (iVar14 == 0) {
                                                        sVar26 = ppVar38->off;
                                                        iVar14 = ptls_buffer_reserve(ppVar38,1);
                                                        if (iVar14 == 0) {
                                                          ppVar38->base[ppVar38->off] = '\0';
                                                          ppVar38->off = ppVar38->off + 1;
                                                          iVar14 = 0;
                                                        }
                                                        bVar44 = true;
                                                        if (iVar14 == 0) {
                                                          sVar31 = ppVar38->off;
                                                          iVar17 = ptls_buffer_reserve(ppVar38,(tls
                                                  ->key_schedule->hashes[0].algo)->digest_size);
                                                  iVar14 = 0;
                                                  if (iVar17 == 0) {
                                                    sVar23 = ppVar38->off +
                                                             (tls->key_schedule->hashes[0].algo)->
                                                             digest_size;
                                                    ppVar38->off = sVar23;
                                                    ppVar38->base[sVar31 - 1] =
                                                         (char)sVar23 - (char)sVar31;
                                                    bVar43 = true;
                                                    bVar44 = false;
                                                  }
                                                  else {
                                                    bVar43 = false;
                                                    iVar14 = iVar17;
                                                  }
                                                  }
                                                  else {
                                                    bVar43 = false;
                                                  }
                                                  if (bVar43) {
                                                    uVar29 = ppVar38->off - sVar26;
                                                    lVar22 = 8;
                                                    do {
                                                      ppVar38->base[sVar26 - 2] =
                                                           (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f)
                                                                    );
                                                      lVar22 = lVar22 + -8;
                                                      sVar26 = sVar26 + 1;
                                                    } while (lVar22 != -8);
                                                    bVar44 = false;
                                                  }
                                                  }
                                                  if (!bVar44) {
                                                    uVar29 = ppVar38->off - (long)local_e8;
                                                    lVar22 = 8;
                                                    do {
                                                      (ppVar38->base + -2)[(long)local_e8] =
                                                           (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f)
                                                                    );
                                                      lVar22 = lVar22 + -8;
                                                      local_e8 = (ptls_handshake_properties_t *)
                                                                 ((long)&(local_e8->field_0).client.
                                                                         negotiated_protocols.list +
                                                                 1);
                                                    } while (lVar22 != -8);
                                                    goto LAB_0010c28d;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
                                                iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                if (iVar14 == 0) {
                                                  puVar9 = ppVar38->base;
                                                  sVar26 = ppVar38->off;
                                                  (puVar9 + sVar26)[0] = '\0';
                                                  (puVar9 + sVar26)[1] = '*';
                                                  ppVar38->off = ppVar38->off + 2;
                                                  iVar14 = 0;
                                                }
                                                bVar44 = iVar14 != 0;
                                                if (!bVar44) {
                                                  iVar17 = ptls_buffer_reserve(ppVar38,2);
                                                  if (iVar17 == 0) {
                                                    puVar9 = ppVar38->base;
                                                    sVar26 = ppVar38->off;
                                                    (puVar9 + sVar26)[0] = '\0';
                                                    (puVar9 + sVar26)[1] = '\0';
                                                    ppVar38->off = ppVar38->off + 2;
                                                    iVar17 = 0;
                                                  }
                                                  bVar44 = true;
                                                  iVar14 = iVar17;
                                                  if (iVar17 == 0) {
                                                    sVar26 = ppVar38->off;
                                                    lVar22 = -2;
                                                    do {
                                                      ppVar38->base[lVar22 + sVar26] = '\0';
                                                      lVar22 = lVar22 + 1;
                                                    } while (lVar22 != 0);
                                                    bVar44 = false;
                                                    iVar14 = 0;
                                                  }
                                                  if (iVar17 == 0) goto LAB_0010bd20;
                                                }
                                              }
                                            }
                                            else {
                                              iVar14 = ptls_buffer_reserve(ppVar38,2);
                                              if (iVar14 == 0) {
                                                puVar9 = ppVar38->base;
                                                sVar26 = ppVar38->off;
                                                (puVar9 + sVar26)[0] = '\0';
                                                (puVar9 + sVar26)[1] = '-';
                                                ppVar38->off = ppVar38->off + 2;
                                                iVar14 = 0;
                                              }
                                              bVar44 = iVar14 != 0;
                                              if (!bVar44) {
                                                iVar14 = ptls_buffer_reserve(ppVar38,2);
                                                if (iVar14 == 0) {
                                                  puVar9 = ppVar38->base;
                                                  sVar26 = ppVar38->off;
                                                  (puVar9 + sVar26)[0] = '\0';
                                                  (puVar9 + sVar26)[1] = '\0';
                                                  ppVar38->off = ppVar38->off + 2;
                                                  iVar14 = 0;
                                                }
                                                bVar44 = true;
                                                if (iVar14 == 0) {
                                                  sVar26 = ppVar38->off;
                                                  iVar14 = ptls_buffer_reserve(ppVar38,1);
                                                  if (iVar14 == 0) {
                                                    ppVar38->base[ppVar38->off] = '\0';
                                                    ppVar38->off = ppVar38->off + 1;
                                                    iVar14 = 0;
                                                  }
                                                  bVar44 = true;
                                                  if (iVar14 == 0) {
                                                    sVar31 = ppVar38->off;
                                                    if ((tls->ctx->field_0x70 & 1) == 0) {
                                                      iVar14 = ptls_buffer_reserve(ppVar38,1);
                                                      if (iVar14 == 0) {
                                                        ppVar38->base[ppVar38->off] = '\0';
                                                        ppVar38->off = ppVar38->off + 1;
                                                        iVar14 = 0;
                                                      }
                                                      if (iVar14 != 0) goto LAB_0010bcad;
                                                    }
                                                    iVar14 = ptls_buffer_reserve(ppVar38,1);
                                                    if (iVar14 == 0) {
                                                      ppVar38->base[ppVar38->off] = '\x01';
                                                      ppVar38->off = ppVar38->off + 1;
                                                      iVar14 = 0;
                                                    }
                                                    bVar43 = false;
                                                    if (iVar14 == 0) {
                                                      ppVar38->base[sVar31 - 1] =
                                                           (char)(int)ppVar38->off - (char)sVar31;
                                                      bVar43 = true;
                                                      bVar44 = false;
                                                      iVar14 = 0;
                                                    }
                                                  }
                                                  else {
LAB_0010bcad:
                                                    bVar43 = false;
                                                  }
                                                  if (bVar43) {
                                                    uVar29 = ppVar38->off - sVar26;
                                                    lVar22 = 8;
                                                    do {
                                                      ppVar38->base[sVar26 - 2] =
                                                           (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f)
                                                                    );
                                                      lVar22 = lVar22 + -8;
                                                      sVar26 = sVar26 + 1;
                                                    } while (lVar22 != -8);
                                                    bVar44 = false;
                                                  }
                                                }
                                                if (!bVar44) goto LAB_0010bcf4;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                                          if (iVar14 == 0) {
                                            puVar9 = ppVar38->base;
                                            sVar26 = ppVar38->off;
                                            (puVar9 + sVar26)[0] = '\0';
                                            (puVar9 + sVar26)[1] = '\x14';
                                            ppVar38->off = ppVar38->off + 2;
                                            iVar14 = 0;
                                          }
                                          bVar44 = iVar14 != 0;
                                          if (!bVar44) {
                                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                                            if (iVar14 == 0) {
                                              puVar9 = ppVar38->base;
                                              sVar26 = ppVar38->off;
                                              (puVar9 + sVar26)[0] = '\0';
                                              (puVar9 + sVar26)[1] = '\0';
                                              ppVar38->off = ppVar38->off + 2;
                                              iVar14 = 0;
                                            }
                                            bVar44 = true;
                                            if (iVar14 == 0) {
                                              sVar26 = ppVar38->off;
                                              iVar14 = ptls_buffer_reserve(ppVar38,1);
                                              if (iVar14 == 0) {
                                                ppVar38->base[ppVar38->off] = '\0';
                                                ppVar38->off = ppVar38->off + 1;
                                                iVar14 = 0;
                                              }
                                              bVar44 = true;
                                              if (iVar14 == 0) {
                                                sVar31 = ppVar38->off;
                                                iVar14 = ptls_buffer_reserve(ppVar38,1);
                                                if (iVar14 == 0) {
                                                  ppVar38->base[ppVar38->off] = '\x02';
                                                  ppVar38->off = ppVar38->off + 1;
                                                  iVar14 = 0;
                                                }
                                                bVar43 = false;
                                                if (iVar14 == 0) {
                                                  ppVar38->base[sVar31 - 1] =
                                                       (char)(int)ppVar38->off - (char)sVar31;
                                                  bVar43 = true;
                                                  bVar44 = false;
                                                  iVar14 = 0;
                                                }
                                              }
                                              else {
                                                bVar43 = false;
                                              }
                                              if (bVar43) {
                                                uVar29 = ppVar38->off - sVar26;
                                                lVar22 = 8;
                                                do {
                                                  ppVar38->base[sVar26 - 2] =
                                                       (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                                  lVar22 = lVar22 + -8;
                                                  sVar26 = sVar26 + 1;
                                                } while (lVar22 != -8);
                                                bVar44 = false;
                                              }
                                            }
                                            if (!bVar44) goto LAB_0010bafd;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\x1b';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = iVar14 != 0;
                            if (!bVar44) {
                              iVar14 = ptls_buffer_reserve(ppVar38,2);
                              if (iVar14 == 0) {
                                puVar9 = ppVar38->base;
                                sVar26 = ppVar38->off;
                                (puVar9 + sVar26)[0] = '\0';
                                (puVar9 + sVar26)[1] = '\0';
                                ppVar38->off = ppVar38->off + 2;
                                iVar14 = 0;
                              }
                              bVar44 = true;
                              if (iVar14 == 0) {
                                sVar26 = ppVar38->off;
                                iVar14 = ptls_buffer_reserve(ppVar38,1);
                                if (iVar14 == 0) {
                                  ppVar38->base[ppVar38->off] = '\0';
                                  ppVar38->off = ppVar38->off + 1;
                                  iVar14 = 0;
                                }
                                bVar44 = true;
                                if (iVar14 == 0) {
                                  puVar37 = tls->ctx->decompress_certificate->supported_algorithms;
                                  if (*puVar37 == 0xffff) {
                                    __assert_fail("*algo != UINT16_MAX",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0x80e,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                 );
                                  }
                                  local_c8 = ppVar38->off;
                                  bVar44 = false;
                                  local_f0 = (ptls_key_exchange_algorithm_t **)
                                             CONCAT62(local_f0._2_6_,*puVar37);
                                  if (*puVar37 == 0xffff) {
                                    bVar43 = true;
                                    iVar14 = 0;
                                  }
                                  else {
                                    do {
                                      puVar37 = puVar37 + 1;
                                      iVar14 = ptls_buffer_reserve(ppVar38,2);
                                      if (iVar14 == 0) {
                                        *(ushort *)(ppVar38->base + ppVar38->off) =
                                             (ushort)local_f0 << 8 | (ushort)local_f0 >> 8;
                                        ppVar38->off = ppVar38->off + 2;
                                        iVar14 = 0;
                                      }
                                      bVar43 = iVar14 == 0;
                                      if (!bVar43) {
                                        bVar44 = true;
                                        break;
                                      }
                                      local_f0 = (ptls_key_exchange_algorithm_t **)
                                                 CONCAT62(local_f0._2_6_,*puVar37);
                                    } while (*puVar37 != 0xffff);
                                  }
                                  if (bVar43) {
                                    ppVar38->base[local_c8 - 1] =
                                         (char)(int)ppVar38->off - (char)local_c8;
                                    bVar44 = false;
                                  }
                                }
                                if (!bVar44) {
                                  uVar29 = ppVar38->off - sVar26;
                                  lVar22 = 8;
                                  do {
                                    ppVar38->base[sVar26 - 2] =
                                         (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                    lVar22 = lVar22 + -8;
                                    sVar26 = sVar26 + 1;
                                  } while (lVar22 != -8);
                                  bVar44 = false;
                                }
                              }
                              if (!bVar44) goto LAB_0010b272;
                            }
                          }
                        }
                        else {
                          iVar14 = ptls_buffer_reserve(ppVar38,2);
                          if (iVar14 == 0) {
                            puVar9 = ppVar38->base;
                            sVar26 = ppVar38->off;
                            (puVar9 + sVar26)[0] = '\0';
                            (puVar9 + sVar26)[1] = '\x10';
                            ppVar38->off = ppVar38->off + 2;
                            iVar14 = 0;
                          }
                          bVar44 = iVar14 != 0;
                          if (!bVar44) {
                            iVar14 = ptls_buffer_reserve(ppVar38,2);
                            if (iVar14 == 0) {
                              puVar9 = ppVar38->base;
                              sVar26 = ppVar38->off;
                              (puVar9 + sVar26)[0] = '\0';
                              (puVar9 + sVar26)[1] = '\0';
                              ppVar38->off = ppVar38->off + 2;
                              iVar14 = 0;
                            }
                            bVar44 = true;
                            if (iVar14 == 0) {
                              sVar26 = ppVar38->off;
                              iVar14 = ptls_buffer_reserve(ppVar38,2);
                              if (iVar14 == 0) {
                                puVar9 = ppVar38->base;
                                sVar31 = ppVar38->off;
                                (puVar9 + sVar31)[0] = '\0';
                                (puVar9 + sVar31)[1] = '\0';
                                ppVar38->off = ppVar38->off + 2;
                                iVar14 = 0;
                              }
                              bVar44 = true;
                              if (iVar14 == 0) {
                                local_f0 = (ptls_key_exchange_algorithm_t **)ppVar38->off;
                                if ((local_e8->field_0).client.negotiated_protocols.count == 0) {
                                  bVar44 = false;
                                  iVar14 = 0;
                                }
                                else {
                                  lVar22 = 8;
                                  local_c8 = 0;
                                  do {
                                    iVar14 = ptls_buffer_reserve(ppVar38,1);
                                    if (iVar14 == 0) {
                                      ppVar38->base[ppVar38->off] = '\0';
                                      ppVar38->off = ppVar38->off + 1;
                                      iVar14 = 0;
                                    }
                                    bVar44 = true;
                                    if (iVar14 == 0) {
                                      local_b0 = (char *)ppVar38->off;
                                      ppVar39 = (local_e8->field_0).client.negotiated_protocols.list
                                      ;
                                      iVar14 = ptls_buffer__do_pushv
                                                         (ppVar38,*(void **)((long)ppVar39 +
                                                                            lVar22 + -8),
                                                          *(size_t *)((long)&ppVar39->base + lVar22)
                                                         );
                                      bVar44 = iVar14 != 0;
                                      if (iVar14 == 0) {
                                        local_b0[(long)(ppVar38->base + -1)] =
                                             (char)(int)ppVar38->off - (char)local_b0;
                                        bVar44 = false;
                                      }
                                    }
                                    if (bVar44) goto LAB_0010b01c;
                                    local_c8 = local_c8 + 1;
                                    lVar22 = lVar22 + 0x10;
                                  } while (local_c8 !=
                                           (local_e8->field_0).client.negotiated_protocols.count);
                                  bVar44 = false;
                                }
LAB_0010b01c:
                                if (!bVar44) {
                                  uVar29 = ppVar38->off - (long)local_f0;
                                  lVar22 = 8;
                                  do {
                                    (ppVar38->base + -2)[(long)local_f0] =
                                         (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                    lVar22 = lVar22 + -8;
                                    local_f0 = (ptls_key_exchange_algorithm_t **)
                                               ((long)local_f0 + 1);
                                  } while (lVar22 != -8);
                                  bVar44 = false;
                                }
                              }
                              if (!bVar44) {
                                uVar29 = ppVar38->off - sVar26;
                                lVar22 = 8;
                                do {
                                  ppVar38->base[sVar26 - 2] =
                                       (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
                                  lVar22 = lVar22 + -8;
                                  sVar26 = sVar26 + 1;
                                } while (lVar22 != -8);
                                bVar44 = false;
                              }
                            }
                            if (!bVar44) goto LAB_0010b0a6;
                          }
                        }
                      }
                    }
LAB_0010b2b9:
                    if (!bVar44) {
                      sVar26 = ppVar38->off;
                      lVar22 = 8;
                      bVar44 = false;
                      sVar31 = local_88;
                      do {
                        ppVar38->base[sVar31 - 2] =
                             (uint8_t)(sVar26 - local_88 >> ((byte)lVar22 & 0x3f));
                        lVar22 = lVar22 + -8;
                        sVar31 = sVar31 + 1;
                      } while (lVar22 != -8);
                    }
                  }
                }
              }
            }
          }
        }
        ppVar39 = local_c0;
        ppVar42 = local_d8;
        if (!bVar44) {
          uVar29 = local_d0->off - sVar40;
          lVar22 = 0x10;
          do {
            local_d0->base[sVar40 - 3] = (uint8_t)(uVar29 >> ((byte)lVar22 & 0x3f));
            lVar22 = lVar22 + -8;
            sVar40 = sVar40 + 1;
          } while (lVar22 != -8);
          bVar44 = false;
        }
      }
    }
    if (!bVar44) {
      iVar14 = (*emitter->commit_message)(emitter);
      bVar44 = iVar14 != 0;
    }
  }
  else {
    bVar44 = true;
  }
  if (!bVar44) {
    if (bVar44) {
      return iVar14;
    }
    ppVar34 = ppVar39;
    local_d8 = ppVar42;
    if (local_e0 != (ptls_iovec_t *)0x0) {
      sVar40 = emitter->buf->off;
      ppVar42 = tls->key_schedule;
      ppVar30 = ppVar42->hashes[0].algo;
      sVar26 = ppVar30->digest_size;
      local_108 = (ptls_iovec_t *)ppVar30->empty_digest;
      secret.base = ppVar42->secret;
      hash_value.len = sVar26;
      hash_value.base = (uint8_t *)local_108;
      secret.len = sVar26;
      sStack_100 = sVar26;
      iVar14 = hkdf_expand_label(ppVar30,local_78,sVar26,secret,"res binder",hash_value,
                                 ppVar42->hkdf_label_prefix);
      if (iVar14 == 0) {
        ppVar34 = (ptls_iovec_t *)((sVar40 - sVar26) + -3);
        ppVar42 = tls->key_schedule;
        if (ppVar42->num_hashes != 0) {
          puVar9 = emitter->buf->base;
          pppVar25 = &ppVar42->hashes[0].ctx;
          sVar40 = 0;
          do {
            (*(*pppVar25)->update)
                      (*pppVar25,(uint8_t *)((long)&ppVar39->base + (long)puVar9),
                       (long)ppVar34 - (long)ppVar39);
            sVar40 = sVar40 + 1;
            pppVar25 = pppVar25 + 2;
          } while (sVar40 != ppVar42->num_hashes);
        }
        iVar14 = calc_verify_data((uint8_t *)((long)&ppVar34->base + (long)(emitter->buf->base + 3))
                                  ,tls->key_schedule,local_78);
        bVar44 = iVar14 == 0;
      }
      else {
        bVar44 = false;
      }
      if (!bVar44) goto LAB_0010b522;
    }
    ppVar42 = tls->key_schedule;
    if (ppVar42->num_hashes != 0) {
      puVar9 = emitter->buf->base;
      sVar40 = emitter->buf->off;
      pppVar25 = &ppVar42->hashes[0].ctx;
      sVar26 = 0;
      do {
        (*(*pppVar25)->update)
                  (*pppVar25,(uint8_t *)((long)&ppVar34->base + (long)puVar9),sVar40 - (long)ppVar34
                  );
        sVar26 = sVar26 + 1;
        pppVar25 = pppVar25 + 2;
      } while (sVar26 != ppVar42->num_hashes);
    }
    ppVar42 = local_d8;
    if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
      if (local_d8 != (ptls_key_schedule_t *)0x0) {
        __assert_fail("!is_second_flight",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x85f,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      iVar14 = setup_traffic_protection(tls,1,"c e traffic",1,0);
      if ((iVar14 != 0) || (iVar14 = push_change_cipher_spec(tls,emitter), iVar14 != 0))
      goto LAB_0010b522;
    }
    if ((ppVar42 != (ptls_key_schedule_t *)0x0 || local_e0 == (ptls_iovec_t *)0x0) ||
       (iVar14 = derive_exporter_secret(tls,1), iVar14 == 0)) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO - (local_b8 == (ptls_iovec_t *)0x0);
      iVar14 = 0x202;
    }
  }
LAB_0010b522:
  if (server_name != (char *)0x0) {
    free(server_name);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return iVar14;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(tls->ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (tls->ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}